

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O1

size_t __thiscall axl::err::Error::createSimpleError(Error *this,Guid *guid,uint_t code)

{
  ErrorHdr *pEVar1;
  undefined8 uVar2;
  size_t sVar3;
  
  sVar3 = 0x18;
  rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::createBuffer
            (&this->super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>,0x18,
             false);
  pEVar1 = (this->super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>).
           super_ErrorRef.super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_p;
  if (pEVar1 == (ErrorHdr *)0x0) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    pEVar1->m_size = 0x18;
    uVar2 = *(undefined8 *)((long)&guid->field_0 + 8);
    *(undefined8 *)&(pEVar1->m_guid).field_0 = *(undefined8 *)&guid->field_0;
    *(undefined8 *)((long)&(pEVar1->m_guid).field_0 + 8) = uVar2;
    ((this->super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>).super_ErrorRef
     .super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>.m_p)->m_code = code;
  }
  return sVar3;
}

Assistant:

size_t
Error::createSimpleError(
	const sl::Guid& guid,
	uint_t code
) {
	createBuffer(sizeof(ErrorHdr));
	if (!m_p)
		return -1;

	m_p->m_size = sizeof(ErrorHdr);
	m_p->m_guid = guid;
	m_p->m_code = code;
	return sizeof(ErrorHdr);
}